

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O3

hash_t __thiscall duckdb::Hash<duckdb::interval_t>(duckdb *this,interval_t val)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = val._0_8_ % 86400000000;
  lVar4 = ((long)this >> 0x20) + val._0_8_ / 86400000000;
  uVar2 = lVar4 % 0x1e;
  uVar3 = (long)(int)this + lVar4 / 0x1e;
  uVar2 = (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
  uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d ^
          (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d ^
          (uVar2 >> 0x20 ^ uVar2) * -0x2917014799a6026d;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

hash_t Hash(interval_t val) {
	int64_t months, days, micros;
	val.Normalize(months, days, micros);
	return Hash(days) ^ Hash(months) ^ Hash(micros);
}